

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::InitFromBuffer(InterchangeObject *this,byte_t *p,ui32_t l)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  KLVPacket local_228;
  Result_t local_1c0 [104];
  undefined1 local_158 [8];
  TLVReader MemRDR;
  KLVPacket local_108;
  Result_t local_90 [8];
  Result_t result;
  ui32_t l_local;
  byte_t *p_local;
  InterchangeObject *this_local;
  
  if (CONCAT44(in_register_00000014,l) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
    return this;
  }
  Kumu::Result_t::Result_t(local_90,(Result_t *)Kumu::RESULT_FALSE);
  bVar1 = Kumu::Identifier<16U>::HasValue((Identifier<16U> *)(p + 0x28));
  if (bVar1) {
    KLVPacket::InitFromBuffer(&local_108,p,l,(UL *)(ulong)in_ECX);
    Kumu::Result_t::operator=(local_90,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
    iVar2 = Kumu::Result_t::operator_cast_to_int(local_90);
    if (-1 < iVar2) {
      if (CONCAT44(in_register_00000014,l) + (ulong)in_ECX <
          (ulong)(*(long *)(p + 0x18) + *(long *)(p + 0x20))) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Interchange Object value extends past buffer length.\n");
        MemRDR.m_Lookup._4_4_ = 0x5c9;
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        goto LAB_0023a8c2;
      }
      TLVReader::TLVReader
                ((TLVReader *)local_158,*(byte_t **)(p + 0x18),*(ui32_t *)(p + 0x20),
                 *(IPrimerLookup **)(p + 0x50));
      (**(code **)(*(long *)p + 0x60))(local_1c0,p,local_158);
      Kumu::Result_t::operator=(local_90,local_1c0);
      Kumu::Result_t::~Result_t(local_1c0);
      TLVReader::~TLVReader((TLVReader *)local_158);
    }
  }
  else {
    KLVPacket::InitFromBuffer(&local_228,p,l);
    Kumu::Result_t::operator=(local_90,(Result_t *)&local_228);
    Kumu::Result_t::~Result_t((Result_t *)&local_228);
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_90);
LAB_0023a8c2:
  MemRDR.m_Lookup._0_4_ = 1;
  Kumu::Result_t::~Result_t(local_90);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::InitFromBuffer(const byte_t* p, ui32_t l)
{
  ASDCP_TEST_NULL(p);
  Result_t result = RESULT_FALSE;

  if ( m_UL.HasValue() )
    {
      result = KLVPacket::InitFromBuffer(p, l, m_UL);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( ( m_ValueStart + m_ValueLength ) > ( p  + l ) )
	    {
	      DefaultLogSink().Error("Interchange Object value extends past buffer length.\n");
	      return RESULT_KLV_CODING(__LINE__, __FILE__);
	    }

	  TLVReader MemRDR(m_ValueStart, m_ValueLength, m_Lookup);
	  result = InitFromTLVSet(MemRDR);
	}
    }
  else
    {
      result = KLVPacket::InitFromBuffer(p, l);
    }
  
  return result;
}